

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O3

ptls_aead_context_t * create_retry_aead(quicly_context_t *ctx,uint32_t protocol_version,int is_enc)

{
  ptls_cipher_suite_t *ppVar1;
  undefined1 *puVar2;
  ptls_cipher_suite_t **pppVar3;
  ptls_aead_context_t *ppVar4;
  undefined1 *puVar5;
  
  puVar2 = (undefined1 *)0x0;
  if (protocol_version == 0xff00001b) {
    puVar2 = get_salt_draft27;
  }
  puVar5 = get_salt_current;
  if (protocol_version != 0xff00001d) {
    puVar5 = puVar2;
  }
  if (puVar5 == (undefined1 *)0x0) {
    __assert_fail("salt != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/../lib/quicly.c"
                  ,0x22b,"ptls_aead_context_t *create_retry_aead(quicly_context_t *, uint32_t, int)"
                 );
  }
  pppVar3 = ctx->tls->cipher_suites;
  if (pppVar3 == (ptls_cipher_suite_t **)0x0) {
    __assert_fail("cs != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/../lib/quicly.c"
                  ,0x210,"ptls_cipher_suite_t *get_aes128gcmsha256(quicly_context_t *)");
  }
  do {
    ppVar1 = *pppVar3;
    pppVar3 = pppVar3 + 1;
  } while (ppVar1->id != 0x1301);
  ppVar4 = ptls_aead_new_direct(ppVar1->aead,is_enc,puVar5 + 0x14,puVar5 + 0x24);
  if (ppVar4 != (ptls_aead_context_t *)0x0) {
    return ppVar4;
  }
  __assert_fail("aead != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/../lib/quicly.c"
                ,0x22f,"ptls_aead_context_t *create_retry_aead(quicly_context_t *, uint32_t, int)");
}

Assistant:

static ptls_aead_context_t *create_retry_aead(quicly_context_t *ctx, uint32_t protocol_version, int is_enc)
{
    const struct st_ptls_salt_t *salt = get_salt(protocol_version);
    assert(salt != NULL);

    ptls_cipher_suite_t *algo = get_aes128gcmsha256(ctx);
    ptls_aead_context_t *aead = ptls_aead_new_direct(algo->aead, is_enc, salt->retry.key, salt->retry.iv);
    assert(aead != NULL);
    return aead;
}